

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ScalarReplacementPass::CheckStore
          (ScalarReplacementPass *this,Instruction *inst,uint32_t index)

{
  uint32_t uVar1;
  
  if (index != 0) {
    return false;
  }
  uVar1 = Instruction::NumInOperands(inst);
  if ((2 < uVar1) && (uVar1 = Instruction::GetSingleWordInOperand(inst,2), (uVar1 & 1) != 0)) {
    return false;
  }
  return true;
}

Assistant:

bool ScalarReplacementPass::CheckStore(const Instruction* inst,
                                       uint32_t index) const {
  if (index != 0u) return false;
  if (inst->NumInOperands() >= 3 &&
      inst->GetSingleWordInOperand(2u) &
          uint32_t(spv::MemoryAccessMask::Volatile))
    return false;
  return true;
}